

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cpp
# Opt level: O2

vector<Card,_std::allocator<Card>_> * __thiscall
Node::get_untried_moves
          (vector<Card,_std::allocator<Card>_> *__return_storage_ptr__,Node *this,
          vector<Card,_std::allocator<Card>_> *legalMoves)

{
  pointer ppNVar1;
  vector<Card,_std::allocator<Card>_> tried_cards;
  Card triedCard;
  _Vector_base<Card,_std::allocator<Card>_> local_58;
  value_type local_38;
  
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (ppNVar1 = (this->m_children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppNVar1 !=
      (this->m_children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppNVar1 = ppNVar1 + 1) {
    local_38 = *(value_type *)(*ppNVar1)->m_move;
    std::vector<Card,_std::allocator<Card>_>::push_back
              ((vector<Card,_std::allocator<Card>_> *)&local_58,&local_38);
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<Card*,std::vector<Card,std::allocator<Card>>>,__gnu_cxx::__ops::_Iter_less_iter>
            ((legalMoves->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (legalMoves->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  std::
  __sort<__gnu_cxx::__normal_iterator<Card*,std::vector<Card,std::allocator<Card>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (local_58._M_impl.super__Vector_impl_data._M_start,
             local_58._M_impl.super__Vector_impl_data._M_finish);
  (__return_storage_ptr__->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  __set_difference<__gnu_cxx::__normal_iterator<Card*,std::vector<Card,std::allocator<Card>>>,__gnu_cxx::__normal_iterator<Card*,std::vector<Card,std::allocator<Card>>>,std::back_insert_iterator<std::vector<Card,std::allocator<Card>>>,__gnu_cxx::__ops::_Iter_less_iter>
            ((legalMoves->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (legalMoves->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.
             super__Vector_impl_data._M_finish,local_58._M_impl.super__Vector_impl_data._M_start,
             local_58._M_impl.super__Vector_impl_data._M_finish,__return_storage_ptr__);
  std::_Vector_base<Card,_std::allocator<Card>_>::~_Vector_base(&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Card> Node::get_untried_moves(std::vector<Card> legalMoves)
{
    std::vector<Card> tried_cards;
    for (std::vector<Node*>::iterator childIterator = m_children.begin();
         childIterator != m_children.end(); ++childIterator)
    {
        player_move* tried_move = (*childIterator)->get_move();
        Card triedCard = std::get<1>(*tried_move);
        tried_cards.push_back(triedCard);
    }

    std::sort(legalMoves.begin(), legalMoves.end());
    std::sort(tried_cards.begin(), tried_cards.end());

    std::vector<Card> untried_moves;
    std::set_difference (legalMoves.begin(), legalMoves.end(), tried_cards.begin(), tried_cards.end(), back_inserter(untried_moves));

    return untried_moves;
}